

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cc
# Opt level: O2

void AssertParse(State *state,char *input,ManifestParserOptions opts)

{
  Test *pTVar1;
  bool bVar2;
  allocator<char> local_c1;
  string err;
  string local_a0;
  ManifestParser parser;
  
  ManifestParser::ManifestParser(&parser,state,(FileReader *)0x0,opts);
  pTVar1 = g_current_test;
  err._M_dataplus._M_p = (pointer)&err.field_2;
  err._M_string_length = 0;
  err.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,input,&local_c1);
  bVar2 = ManifestParser::ParseTest(&parser,&local_a0,&err);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/test.cc",
             0x6f,"parser.ParseTest(input, &err)");
  std::__cxx11::string::~string((string *)&local_a0);
  pTVar1 = g_current_test;
  bVar2 = std::operator==("",&err);
  bVar2 = testing::Test::Check
                    (pTVar1,bVar2,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/test.cc"
                     ,0x70,"\"\" == err");
  if (bVar2) {
    VerifyGraph(state);
  }
  else {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  }
  std::__cxx11::string::~string((string *)&err);
  return;
}

Assistant:

void AssertParse(State* state, const char* input,
                 ManifestParserOptions opts) {
  ManifestParser parser(state, NULL, opts);
  string err;
  EXPECT_TRUE(parser.ParseTest(input, &err));
  ASSERT_EQ("", err);
  VerifyGraph(*state);
}